

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CMU462::Collada::ColladaWriter::writeHeader(ofstream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)out,"<?xml version=\"1.0\" encoding=\"utf-8\"?>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,
                           "<COLLADA xmlns=\"http://www.collada.org/2005/11/COLLADASchema\" version=\"1.4.1\">"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"<asset>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"   <contributor>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"      <author>Scotty</author>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,
                           "      <authoring_tool>CMU Scotty3D (version 15-462/662)</authoring_tool>"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"   </contributor>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)out,"   <created>");
  writeCurrentTime(out);
  poVar1 = std::operator<<((ostream *)out,"</created>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)out,"   <modified>");
  writeCurrentTime(out);
  poVar1 = std::operator<<((ostream *)out,"</modified>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"   <unit name=\"meter\" meter=\"1\"/>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"   <up_axis>Y_UP</up_axis>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"</asset>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ColladaWriter::writeHeader( ofstream& out )
{

   out << "<?xml version=\"1.0\" encoding=\"utf-8\"?>" << endl;
   out << "<COLLADA xmlns=\"http://www.collada.org/2005/11/COLLADASchema\" version=\"1.4.1\">" << endl;
   out << "<asset>" << endl;
   out << "   <contributor>" << endl;
   out << "      <author>Scotty</author>" << endl;
   out << "      <authoring_tool>CMU Scotty3D (version 15-462/662)</authoring_tool>" << endl;
   out << "   </contributor>" << endl;
   out << "   <created>";
   writeCurrentTime( out );
   out << "</created>" << endl;
   out << "   <modified>";
   writeCurrentTime( out );
   out << "</modified>" << endl;
   out << "   <unit name=\"meter\" meter=\"1\"/>" << endl;
   out << "   <up_axis>Y_UP</up_axis>" << endl;
   out << "</asset>" << endl;
}